

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void kratos::LiftGenVarInstanceVisitor::create_gen_var_instance
               (vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                *generators,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
               *port_mapping)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  enable_shared_from_this<kratos::Stmt> *__r;
  pointer ppMVar2;
  ModuleInstantiationStmt *pMVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  __node_base_ptr p_Var6;
  shared_ptr<kratos::Var> *var;
  mapped_type pVVar7;
  element_type *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Alloc_hider _Var9;
  int iVar10;
  undefined8 this_00;
  undefined4 extraout_var;
  long lVar11;
  mapped_type *ppVVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
  *extraout_RDX;
  vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
  *extraout_RDX_00;
  vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
  *generators_00;
  pointer ppMVar13;
  _Hash_node_base *p_Var14;
  shared_ptr<kratos::Var> sVar15;
  shared_ptr<kratos::AssignStmt> sVar16;
  undefined1 local_190 [8];
  string new_var;
  shared_ptr<kratos::Stmt> local_150;
  undefined1 local_140 [8];
  value_type mapping;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  string blk_name;
  undefined8 local_98;
  element_type *local_90;
  mapped_type pVStack_88;
  shared_ptr<kratos::Var> target_var;
  undefined1 local_70 [8];
  shared_ptr<kratos::Port> port;
  shared_ptr<kratos::ForStmt> for_stmt;
  undefined8 local_48;
  _Alloc_hider _Stack_40;
  
  this_00 = Stmt::generator_parent
                      (&(*(generators->
                          super__Vector_base<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                          )._M_impl.super__Vector_impl_data._M_start)->super_Stmt);
  local_140 = (undefined1  [8])&mapping.first._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_c8 = (undefined1  [8])&blk_name._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"i","");
  Generator::get_unique_variable_name
            ((string *)local_190,(Generator *)this_00,(string *)local_140,(string *)local_c8);
  if (local_c8 != (undefined1  [8])&blk_name._M_string_length) {
    operator_delete((void *)local_c8,blk_name._M_string_length + 1);
  }
  if (local_140 != (undefined1  [8])&mapping.first._M_string_length) {
    operator_delete((void *)local_140,mapping.first._M_string_length + 1);
  }
  local_c8 = (undefined1  [8])((ulong)local_c8 & 0xffffffff00000000);
  local_140 = (undefined1  [8])
              ((long)(generators->
                     super__Vector_base<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(generators->
                     super__Vector_base<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3);
  local_70._0_4_ = 1;
  port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::ForStmt,std::allocator<kratos::ForStmt>,std::__cxx11::string_const&,int,unsigned_long,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&for_stmt,
             (ForStmt **)
             &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (allocator<kratos::ForStmt> *)local_d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
             (int *)local_c8,(unsigned_long *)local_140,(int *)local_70);
  std::__shared_ptr<kratos::ForStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::ForStmt,kratos::ForStmt>
            ((__shared_ptr<kratos::ForStmt,(__gnu_cxx::_Lock_policy)2> *)
             &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (ForStmt *)
             port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  mapping.second._M_h._M_single_bucket =
       (__node_base_ptr)
       port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0xc].
       _vptr__Sp_counted_base;
  for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0xc].
         _M_use_count;
  if (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  *(undefined1 *)&mapping.second._M_h._M_single_bucket[0x50]._M_nxt = 1;
  local_150.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_150.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar1 = &((for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar1 = &((for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  Generator::add_stmt((Generator *)this_00,&local_150);
  generators_00 = extraout_RDX;
  if ((element_type *)
      local_150.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    generators_00 = extraout_RDX_00;
  }
  find_common_instance_name_abi_cxx11_
            ((string *)local_c8,(LiftGenVarInstanceVisitor *)generators,generators_00);
  local_140 = *(undefined1 (*) [8])
               &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                [0xe]._M_use_count;
  mapping.first._M_dataplus._M_p =
       (pointer)port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                [0xf]._vptr__Sp_counted_base;
  if ((_func_int **)mapping.first._M_dataplus._M_p != (_func_int **)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)((long)mapping.first._M_dataplus._M_p + 8) =
           *(int *)((long)mapping.first._M_dataplus._M_p + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)((long)mapping.first._M_dataplus._M_p + 8) =
           *(int *)((long)mapping.first._M_dataplus._M_p + 8) + 1;
    }
  }
  Generator::add_named_block
            ((Generator *)this_00,(string *)local_c8,(shared_ptr<kratos::StmtBlock> *)local_140);
  if (mapping.first._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mapping.first._M_dataplus._M_p);
  }
  ppMVar13 = (generators->
             super__Vector_base<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppMVar2 = (generators->
            super__Vector_base<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar13 != ppMVar2) {
    new_var.field_2._8_8_ = this_00;
    do {
      _Var8._M_pi = port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      pMVar3 = *ppMVar13;
      __r = &(pMVar3->super_Stmt).super_enable_shared_from_this<kratos::Stmt>;
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)local_140,
                 (__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)__r);
      std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
      emplace_back<std::shared_ptr<kratos::Stmt>const&>
                ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                  *)&_Var8._M_pi[0xf]._M_use_count,(shared_ptr<kratos::Stmt> *)local_140);
      if (mapping.first._M_dataplus._M_p != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mapping.first._M_dataplus._M_p);
      }
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)local_140,
                 (__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)__r);
      Generator::remove_stmt((Generator *)this_00,(shared_ptr<kratos::Stmt> *)local_140);
      if (mapping.first._M_dataplus._M_p != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mapping.first._M_dataplus._M_p);
      }
      (*(pMVar3->super_Stmt).super_IRNode._vptr_IRNode[7])();
      p_Var14 = (port_mapping->_M_h)._M_before_begin._M_nxt;
      if (p_Var14 != (_Hash_node_base *)0x0) {
        blk_name.field_2._8_8_ = pMVar3->target_;
        do {
          Generator::get_port((Generator *)local_70,(string *)blk_name.field_2._8_8_);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                  *)local_140,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                  *)(p_Var14[7]._M_nxt + 1));
          sVar15 = Generator::get_var((Generator *)local_d8,(string *)this_00);
          pVStack_88 = (mapped_type)0x0;
          target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          if (mapping.second._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
            pVStack_88 = (mapped_type)local_d8._0_8_;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&target_var,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
          }
          else {
            local_98 = mapping.second._M_h._M_single_bucket;
            local_90 = (element_type *)
                       for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
            if (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            iVar10 = (*((IRNode *)local_d8._0_8_)->_vptr_IRNode[10])
                               (local_d8._0_8_,&local_98,
                                sVar15.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._M_pi);
            std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<kratos::Var,void>
                      ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
                       &stack0xffffffffffffffb8,
                       (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                       (CONCAT44(extraout_var,iVar10) + 0x68));
            _Var9._M_p = _Stack_40._M_p;
            pVStack_88 = (mapped_type)local_48;
            this = target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_48 = (mapped_type)0x0;
            _Stack_40._M_p = (pointer)0x0;
            target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)_Var9._M_p;
            if (this != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
            }
            if ((element_type *)_Stack_40._M_p != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_p);
            }
            if (local_90 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90);
            }
          }
          lVar11 = *(long *)CONCAT44(local_70._4_4_,local_70._0_4_);
          if ((int)((long *)CONCAT44(local_70._4_4_,local_70._0_4_))[0x4e] == 0) {
            lVar11 = (**(code **)(lVar11 + 0x80))();
            local_48 = *(undefined8 *)(*(long *)(lVar11 + 0x10) + 8);
            _Stack_40._M_p = *(pointer *)(*(long *)(lVar11 + 0x10) + 0x10);
            if ((element_type *)_Stack_40._M_p != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pvVar1 = &(((element_type *)_Stack_40._M_p)->super_IRNode).fn_name_ln;
                *(int *)&(pvVar1->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar1->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
                UNLOCK();
              }
              else {
                pvVar1 = &(((element_type *)_Stack_40._M_p)->super_IRNode).fn_name_ln;
                *(int *)&(pvVar1->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar1->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
              }
            }
            Generator::remove_stmt
                      ((Generator *)this_00,(shared_ptr<kratos::Stmt> *)&stack0xffffffffffffffb8);
            if ((element_type *)_Stack_40._M_p != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_p);
            }
            (**(code **)(*(long *)CONCAT44(local_70._4_4_,local_70._0_4_) + 0x90))
                      ((long *)CONCAT44(local_70._4_4_,local_70._0_4_),0);
            var = (shared_ptr<kratos::Var> *)CONCAT44(local_70._4_4_,local_70._0_4_);
            sVar16 = Var::assign((Var *)&stack0xffffffffffffffb8,var);
            (*(code *)(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage)
                      (var,(Var *)&stack0xffffffffffffffb8,
                       sVar16.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
            if ((element_type *)_Stack_40._M_p != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_p);
            }
          }
          else {
            lVar11 = (**(code **)(lVar11 + 0x70))();
            local_48 = *(undefined8 *)(*(long *)(lVar11 + 0x10) + 8);
            _Stack_40._M_p = *(pointer *)(*(long *)(lVar11 + 0x10) + 0x10);
            if ((element_type *)_Stack_40._M_p != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pvVar1 = &(((element_type *)_Stack_40._M_p)->super_IRNode).fn_name_ln;
                *(int *)&(pvVar1->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar1->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
                UNLOCK();
              }
              else {
                pvVar1 = &(((element_type *)_Stack_40._M_p)->super_IRNode).fn_name_ln;
                *(int *)&(pvVar1->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar1->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
              }
            }
            Generator::remove_stmt
                      ((Generator *)this_00,(shared_ptr<kratos::Stmt> *)&stack0xffffffffffffffb8);
            if ((element_type *)_Stack_40._M_p != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_p);
            }
            p_Var6 = (__node_base_ptr)CONCAT44(local_70._4_4_,local_70._0_4_);
            local_90 = port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pvVar1 = &((port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->super_Var).super_IRNode.fn_name_ln;
                *(int *)&(pvVar1->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar1->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
                UNLOCK();
              }
              else {
                pvVar1 = &((port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->super_Var).super_IRNode.fn_name_ln;
                *(int *)&(pvVar1->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar1->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
              }
            }
            local_98 = p_Var6;
            sVar16 = Var::assign((Var *)&stack0xffffffffffffffb8,
                                 (shared_ptr<kratos::Var> *)pVStack_88);
            (*(code *)p_Var6->_M_nxt[0x15]._M_nxt)
                      (p_Var6,(Var *)&stack0xffffffffffffffb8,
                       sVar16.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
            if ((element_type *)_Stack_40._M_p != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_p);
            }
            if (local_90 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90);
            }
            (**(code **)(*(long *)CONCAT44(local_70._4_4_,local_70._0_4_) + 0x88))
                      ((long *)CONCAT44(local_70._4_4_,local_70._0_4_),0);
          }
          pVVar7 = pVStack_88;
          local_48 = CONCAT44(local_70._4_4_,local_70._0_4_);
          ppVVar12 = std::
                     map<kratos::Port_*,_kratos::Var_*,_std::less<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Var_*>_>_>
                     ::operator[](&(pMVar3->super_InstantiationStmt).port_mapping_,
                                  (key_type *)&stack0xffffffffffffffb8);
          *ppVVar12 = pVVar7;
          if (target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      );
          }
          this_00 = new_var.field_2._8_8_;
          if ((pointer)local_d8._8_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)((long)&mapping.first.field_2 + 8));
          if (local_140 != (undefined1  [8])&mapping.first._M_string_length) {
            operator_delete((void *)local_140,mapping.first._M_string_length + 1);
          }
          if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          p_Var14 = p_Var14->_M_nxt;
        } while (p_Var14 != (_Hash_node_base *)0x0);
      }
      lVar11 = *(long *)&port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi[0xe]._M_use_count;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               [0xf]._vptr__Sp_counted_base;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      lVar5 = *(long *)(lVar11 + 0xc0);
      lVar11 = *(long *)(lVar11 + 200);
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      if (lVar5 == lVar11) {
        blk_name.field_2._8_4_ =
             port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [0xe]._M_use_count;
        blk_name.field_2._12_4_ =
             port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [0xe]._M_weak_count;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 [0xf]._vptr__Sp_counted_base;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
                  ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)local_140,
                   (__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)__r);
        StmtBlock::add_stmt((StmtBlock *)blk_name.field_2._8_8_,
                            (shared_ptr<kratos::Stmt> *)local_140);
        if (mapping.first._M_dataplus._M_p != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mapping.first._M_dataplus._M_p)
          ;
        }
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
      }
      std::__cxx11::string::_M_replace
                ((ulong)&pMVar3->target_->instance_name,0,
                 (char *)(pMVar3->target_->instance_name)._M_string_length,0x414fe9);
      ppMVar13 = ppMVar13 + 1;
    } while (ppMVar13 != ppMVar2);
  }
  if (local_c8 != (undefined1  [8])&blk_name._M_string_length) {
    operator_delete((void *)local_c8,blk_name._M_string_length + 1);
  }
  if (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (local_190 != (undefined1  [8])&new_var._M_string_length) {
    operator_delete((void *)local_190,new_var._M_string_length + 1);
  }
  return;
}

Assistant:

static void create_gen_var_instance(
        const std::vector<ModuleInstantiationStmt*>& generators,
        const std::unordered_map<std::string, PortInfo>& port_mapping) {
        auto* gen = generators[0]->generator_parent();
        // need to allocate a var name
        auto const new_var = gen->get_unique_variable_name("", "i");
        // need to create a for loop with genvar loop variable
        auto for_stmt = std::make_shared<ForStmt>(new_var, 0, generators.size(), 1);
        // set it to gen var
        auto const& iter = for_stmt->get_iter_var();
        iter->set_is_gen_gar();
        gen->add_stmt(for_stmt);
        auto blk_name = find_common_instance_name(generators);
        gen->add_named_block(blk_name, for_stmt->get_loop_body());
        for (auto* inst : generators) {
            // remove statement first
            // const cast
            auto* s = const_cast<ModuleInstantiationStmt*>(inst);
            for_stmt->add_genvar_stmt(s->shared_from_this());
            gen->remove_stmt(s->shared_from_this());
            s->set_parent(for_stmt.get());
            auto const* child = inst->target();
            // need to rewrite all the connections
            // first we remove all of the connections
            // remote_stmt will take care of the connection if it doesn't exist
            for (auto const& [port_name, info] : port_mapping) {
                auto port = child->get_port(port_name);
                // get the target_var
                auto mapping = *info.begin();
                auto const& target_name = mapping.first;
                auto const& target_var_base = gen->get_var(target_name);
                std::shared_ptr<Var> target_var;
                if (mapping.second.empty()) {
                    target_var = target_var_base;
                } else {
                    target_var = target_var_base->operator[](iter).shared_from_this();
                }
                if (port->port_direction() == PortDirection::In) {
                    auto const& source_stmt = *port->sources().begin();
                    gen->remove_stmt(source_stmt);
                    port->clear_sources(false);
                    port->add_source(port->assign(target_var));
                } else {
                    auto const& sink_stmt = *port->sinks().begin();
                    gen->remove_stmt(sink_stmt);
                    port->add_sink(target_var->assign(port));
                    port->clear_sinks(false);
                }
                inst->set_mapping(port.get(), target_var.get());
            }
            // only need one instance
            if (for_stmt->get_loop_body()->empty()) {
                for_stmt->get_loop_body()->add_stmt(inst->shared_from_this());
            }

            // name all the instance name to inst
            // remove const cast hack
            auto* target_inst = const_cast<Generator*>(s->target());
            target_inst->instance_name = "inst";
        }
    }